

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O1

lzham_compress_status_t
lzham::lzham_lib_compress_memory
          (lzham_compress_params *pParams,lzham_uint8 *pDst_buf,size_t *pDst_len,
          lzham_uint8 *pSrc_buf,size_t src_len,lzham_uint32 *pAdler32)

{
  ulong uVar1;
  bool bVar2;
  lzham_compress_status_t lVar3;
  int iVar4;
  lzcompressor *this;
  ulong __n;
  lzcompressor *this_00;
  lzcompressor *local_70;
  init_params local_58;
  
  lVar3 = LZHAM_COMP_STATUS_INVALID_PARAMETER;
  if (pDst_len != (size_t *)0x0 && pParams != (lzham_compress_params *)0x0) {
    if ((src_len >> 0x20 == 0) && (pSrc_buf != (lzham_uint8 *)0x0 || src_len == 0)) {
      local_58.m_pTask_pool = (task_pool *)0x0;
      local_58.m_max_helper_threads = 0;
      local_58.m_compression_level = cCompressionLevelDefault;
      local_58.m_dict_size_log2 = 0x16;
      local_58.m_block_size = 0x80000;
      local_58.m_num_cachelines = 0;
      local_58.m_cacheline_size = 0;
      local_58.m_lzham_compress_flags = 0;
      lVar3 = create_init_params(&local_58,pParams);
      if (lVar3 == LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
        if (local_58.m_max_helper_threads == 0) {
          local_70 = (lzcompressor *)0x0;
        }
        else {
          local_70 = (lzcompressor *)lzham_malloc(0x2c8,(size_t *)0x0);
          task_pool::task_pool((task_pool *)local_70);
          iVar4 = task_pool::init((task_pool *)local_70,
                                  (EVP_PKEY_CTX *)(local_58._8_8_ & 0xffffffff));
          local_58.m_pTask_pool = (task_pool *)local_70;
          if ((char)iVar4 == '\0') {
            return LZHAM_COMP_STATUS_FAILED;
          }
        }
        this = (lzcompressor *)lzham_malloc(0x5a23e0,(size_t *)0x0);
        this_00 = (lzcompressor *)0x0;
        if (this != (lzcompressor *)0x0) {
          lzcompressor::lzcompressor(this);
          this_00 = this;
        }
        if (this_00 == (lzcompressor *)0x0) {
          if (local_70 == (lzcompressor *)0x0) {
            return LZHAM_COMP_STATUS_FAILED;
          }
          task_pool::~task_pool((task_pool *)local_70);
          lVar3 = LZHAM_COMP_STATUS_FAILED;
        }
        else {
          iVar4 = lzcompressor::init(this_00,(EVP_PKEY_CTX *)&local_58);
          if ((char)iVar4 == '\0') {
            if (local_70 != (lzcompressor *)0x0) {
              task_pool::~task_pool((task_pool *)local_70);
              lzham_free(local_70);
            }
            lzcompressor::~lzcompressor(this_00);
            lVar3 = LZHAM_COMP_STATUS_INVALID_PARAMETER;
            local_70 = this_00;
          }
          else if (((src_len == 0) ||
                   (bVar2 = lzcompressor::put_bytes(this_00,pSrc_buf,(uint)src_len), bVar2)) &&
                  (bVar2 = lzcompressor::put_bytes(this_00,(void *)0x0,0), bVar2)) {
            uVar1 = *pDst_len;
            *pDst_len = (ulong)(this_00->m_comp_buf).m_size;
            if (pAdler32 != (lzham_uint32 *)0x0) {
              *pAdler32 = this_00->m_src_adler32;
            }
            __n = (ulong)(this_00->m_comp_buf).m_size;
            if (uVar1 < __n) {
              lzham_delete<lzham::task_pool>((task_pool *)local_70);
              lzcompressor::~lzcompressor(this_00);
              lVar3 = LZHAM_COMP_STATUS_OUTPUT_BUF_TOO_SMALL;
              local_70 = this_00;
            }
            else {
              memcpy(pDst_buf,(this_00->m_comp_buf).m_p,__n);
              lzham_delete<lzham::task_pool>((task_pool *)local_70);
              lzcompressor::~lzcompressor(this_00);
              lVar3 = LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE;
              local_70 = this_00;
            }
          }
          else {
            *pDst_len = 0;
            lzham_delete<lzham::task_pool>((task_pool *)local_70);
            lzcompressor::~lzcompressor(this_00);
            lVar3 = LZHAM_COMP_STATUS_FAILED;
            local_70 = this_00;
          }
        }
        lzham_free(local_70);
      }
    }
  }
  return lVar3;
}

Assistant:

lzham_compress_status_t lzham_lib_compress_memory(const lzham_compress_params *pParams, lzham_uint8* pDst_buf, size_t *pDst_len, const lzham_uint8* pSrc_buf, size_t src_len, lzham_uint32 *pAdler32)
   {
      if ((!pParams) || (!pDst_len))
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;

      if (src_len)
      {
         if (!pSrc_buf)
            return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }

      if (sizeof(size_t) > sizeof(uint32))
      {
         if (src_len > UINT32_MAX)
            return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }

      lzcompressor::init_params params;
      lzham_compress_status_t status = create_init_params(params, pParams);
      if (status != LZHAM_COMP_STATUS_SUCCESS)
         return status;

      task_pool *pTP = NULL;
      if (params.m_max_helper_threads)
      {
         pTP = lzham_new<task_pool>();
         if (!pTP->init(params.m_max_helper_threads))   
            return LZHAM_COMP_STATUS_FAILED;

         params.m_pTask_pool = pTP;
      }

      lzcompressor *pCompressor = lzham_new<lzcompressor>();
      if (!pCompressor)
      {
         lzham_delete(pTP);
         return LZHAM_COMP_STATUS_FAILED;
      }
      
      if (!pCompressor->init(params))
      {
         lzham_delete(pTP);
         lzham_delete(pCompressor);
         return LZHAM_COMP_STATUS_INVALID_PARAMETER;
      }

      if (src_len)
      {
         if (!pCompressor->put_bytes(pSrc_buf, static_cast<uint32>(src_len)))
         {
            *pDst_len = 0;
            lzham_delete(pTP);
            lzham_delete(pCompressor);
            return LZHAM_COMP_STATUS_FAILED;
         }
      }

      if (!pCompressor->put_bytes(NULL, 0))
      {
         *pDst_len = 0;
         lzham_delete(pTP);
         lzham_delete(pCompressor);
         return LZHAM_COMP_STATUS_FAILED;
      }

      const byte_vec &comp_data = pCompressor->get_compressed_data();

      size_t dst_buf_size = *pDst_len;
      *pDst_len = comp_data.size();

      if (pAdler32)
         *pAdler32 = pCompressor->get_src_adler32();

      if (comp_data.size() > dst_buf_size)
      {
         lzham_delete(pTP);
         lzham_delete(pCompressor);
         return LZHAM_COMP_STATUS_OUTPUT_BUF_TOO_SMALL;
      }

      memcpy(pDst_buf, comp_data.get_ptr(), comp_data.size());

      lzham_delete(pTP);
      lzham_delete(pCompressor);
      return LZHAM_COMP_STATUS_SUCCESS;  
   }